

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream_p.h
# Opt level: O2

QStringView __thiscall QXmlStreamReaderPrivate::symView(QXmlStreamReaderPrivate *this,int index)

{
  Value *pVVar1;
  long lVar2;
  long in_FS_OFFSET;
  QStringView QVar3;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pVVar1 = this->sym_stack;
  lVar2 = (long)index + (long)this->tos;
  local_18.m_data = (this->textBuffer).d.ptr;
  if (local_18.m_data == (char16_t *)0x0) {
    local_18.m_data = L"";
  }
  local_18.m_size = pVVar1[lVar2 + -1].len;
  local_18.m_data = local_18.m_data + pVVar1[lVar2 + -1].pos;
  QVar3 = QStringView::mid(&local_18,(long)pVVar1[lVar2 + -1].prefix,-1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QStringView symView(int index) const
    {
        const Value &symbol = sym(index);
        return QStringView(textBuffer.data() + symbol.pos, symbol.len).mid(symbol.prefix);
    }